

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O2

void __thiscall
VW::config::options_boost_po::add_and_parse(options_boost_po *this,option_group_definition *group)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  __type _Var3;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> *this_01;
  basic_command_line_parser<char> *this_02;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__v;
  pointer __v_00;
  shared_ptr<VW::config::base_option> opt_ptr_1;
  __shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2> local_368;
  basic_parsed_options<char> parsed_options;
  shared_ptr<VW::config::base_option> opt_ptr;
  variables_map vm;
  options_description new_options;
  
  boost::program_options::options_description::options_description
            (&new_options,(string *)group,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  p_Var1 = &((group->m_options).
             super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
  this_00 = &this->m_defined_options;
  for (p_Var4 = &((group->m_options).
                  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
      p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
    std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>,
               p_Var4);
    std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_368,
               &opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>);
    add_to_description(this,(shared_ptr<VW::config::base_option> *)&local_368,&new_options);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_368._M_refcount);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               &(opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_name);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               &(opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_short_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vm,"-",
                   &(opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr)->m_short_name);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vm);
    std::__cxx11::string::~string((string *)&vm);
    this_01 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<VW::config::base_option>_>_>_>
               ::operator[](&this->m_options,
                            &(opt_ptr.
                              super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->m_name)->
               super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_01,&opt_ptr.
                        super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&opt_ptr.super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  boost::program_options::options_description::print((ostream *)&new_options,(int)this + 0x60);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&opt_ptr,&this->m_command_line);
  this_02 = boost::program_options::basic_command_line_parser<char>::options
                      ((basic_command_line_parser<char> *)&opt_ptr,&new_options);
  boost::program_options::detail::cmdline::style((int)this_02);
  boost::program_options::detail::cmdline::allow_unregistered();
  boost::program_options::basic_command_line_parser<char>::run(&parsed_options,this_02);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&opt_ptr);
  for (__v_00 = parsed_options.options.
                super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __v_00 != parsed_options.options.
                super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; __v_00 = __v_00 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->m_supplied_options,&__v_00->string_key);
    pbVar2 = (__v_00->value).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__v = (__v_00->value).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __v != pbVar2; __v = __v + 1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->m_ignore_supplied,__v);
    }
    if (((__v_00->string_key)._M_string_length != 0) &&
       (*(__v_00->string_key)._M_dataplus._M_p == '-')) {
      std::__cxx11::string::substr((ulong)&opt_ptr,(ulong)__v_00);
      p_Var1 = &((group->m_options).
                 super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
                super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
      for (p_Var4 = &((group->m_options).
                      super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                     super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>;
          p_Var4 != p_Var1; p_Var4 = p_Var4 + 1) {
        std::__shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&opt_ptr_1.
                    super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>,p_Var4);
        _Var3 = std::operator==(&(opt_ptr_1.
                                  super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_short_name,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&opt_ptr);
        if (_Var3) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&this->m_supplied_options,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt_ptr);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&opt_ptr_1.
                    super___shared_ptr<VW::config::base_option,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      std::__cxx11::string::~string((string *)&opt_ptr);
    }
  }
  boost::program_options::store((basic_parsed_options *)&parsed_options,&vm,false);
  boost::program_options::notify(&vm);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&parsed_options.options);
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::options_description::~options_description(&new_options);
  return;
}

Assistant:

void options_boost_po::add_and_parse(const option_group_definition& group)
{
  po::options_description new_options(group.m_name);

  for (auto opt_ptr : group.m_options)
  {
    add_to_description(opt_ptr, new_options);
    m_defined_options.insert(opt_ptr->m_name);
    m_defined_options.insert(opt_ptr->m_short_name);
    m_defined_options.insert("-" + opt_ptr->m_short_name);

    // The last definition is kept. There was a bug where using .insert at a later pointer changed the command line but
    // the previously defined option's default value was serialized into the model. This resolves that state info.
    m_options[opt_ptr->m_name] = opt_ptr;
  }

  // Add the help for the given options.
  new_options.print(m_help_stringstream);

  try
  {
    po::variables_map vm;
    auto parsed_options = po::command_line_parser(m_command_line)
                              .options(new_options)
                              .style(po::command_line_style::default_style ^ po::command_line_style::allow_guessing)
                              .allow_unregistered()
                              .run();

    for (auto const& option : parsed_options.options)
    {
      m_supplied_options.insert(option.string_key);

      // If a string is later determined to be a value the erase it. This happens for negative numbers "-2"
      for (auto& val : option.value)
      {
        m_ignore_supplied.insert(val);
      }

      // Parsed options can contain short options in the form -k, we can only check these as the group definitions come
      // in.
      if (option.string_key.length() > 0 && option.string_key[0] == '-')
      {
        auto short_name = option.string_key.substr(1);
        for (auto opt_ptr : group.m_options)
        {
          if (opt_ptr->m_short_name == short_name)
          {
            m_supplied_options.insert(short_name);
          }
        }
      }
    }

    po::store(parsed_options, vm);
    po::notify(vm);
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::invalid_option_value>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::bad_lexical_cast>>& ex)
  {
    THROW_EX(VW::vw_argument_invalid_value_exception, ex.what());
  }
  catch (boost::exception_detail::clone_impl<
      boost::exception_detail::error_info_injector<boost::program_options::ambiguous_option>>& ex)
  {
    THROW(ex.what());
  }
  catch (boost::program_options::ambiguous_option &ex)
  {
    THROW(ex.what());
  }
}